

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_analysis.cpp
# Opt level: O2

BasicBlock * __thiscall
spvtools::opt::DominatorAnalysisBase::CommonDominator
          (DominatorAnalysisBase *this,BasicBlock *b1,BasicBlock *b2)

{
  size_type sVar1;
  BasicBlock *pBVar2;
  __ireturn_type _Var3;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  seen;
  BasicBlock *local_60;
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_58;
  
  if (b2 == (BasicBlock *)0x0 || b1 == (BasicBlock *)0x0) {
    return (BasicBlock *)0x0;
  }
  local_58._M_buckets = &local_58._M_single_bucket;
  local_58._M_bucket_count = 1;
  local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58._M_element_count = 0;
  local_58._M_rehash_policy._M_max_load_factor = 1.0;
  local_58._M_rehash_policy._M_next_resize = 0;
  local_58._M_single_bucket = (__node_base_ptr)0x0;
  while ((b1 != (BasicBlock *)0x0 &&
         (local_60 = b1,
         _Var3 = std::__detail::
                 _Insert_base<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::insert((_Insert_base<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)&local_58,&local_60),
         ((undefined1  [16])_Var3 & (undefined1  [16])0x1) != (undefined1  [16])0x0))) {
    b1 = ImmediateDominator(this,local_60);
  }
  while (local_60 = b2, b2 != (BasicBlock *)0x0) {
    sVar1 = std::
            _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&local_58,&local_60);
    pBVar2 = local_60;
    if (sVar1 != 0) goto LAB_004df877;
    b2 = ImmediateDominator(this,local_60);
  }
  pBVar2 = (BasicBlock *)0x0;
LAB_004df877:
  std::
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_58);
  return pBVar2;
}

Assistant:

BasicBlock* DominatorAnalysisBase::CommonDominator(BasicBlock* b1,
                                                   BasicBlock* b2) const {
  if (!b1 || !b2) return nullptr;

  std::unordered_set<BasicBlock*> seen;
  BasicBlock* block = b1;
  while (block && seen.insert(block).second) {
    block = ImmediateDominator(block);
  }

  block = b2;
  while (block && !seen.count(block)) {
    block = ImmediateDominator(block);
  }

  return block;
}